

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQBool isfmtchr(SQChar ch)

{
  SQChar ch_local;
  SQBool local_8;
  
  if ((((ch == ' ') || (ch == '#')) || (ch == '+')) || ((ch == '-' || (ch == '0')))) {
    local_8 = 1;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static SQBool isfmtchr(SQChar ch)
{
    switch(ch) {
    case '-': case '+': case ' ': case '#': case '0': return SQTrue;
    }
    return SQFalse;
}